

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cc
# Opt level: O0

tm * __thiscall iqxmlrpc::Value::operator_cast_to_tm(tm *__return_storage_ptr__,Value *this)

{
  tm *__src;
  Date_time local_70;
  Value *local_10;
  Value *this_local;
  
  local_10 = this;
  get_datetime(&local_70,this);
  __src = Date_time::get_tm(&local_70);
  memcpy(__return_storage_ptr__,__src,0x38);
  Date_time::~Date_time(&local_70);
  return __return_storage_ptr__;
}

Assistant:

Value::operator struct tm() const
{
  return get_datetime().get_tm();
}